

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void curve_vis(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,t_float basey
              ,int vis)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _glist *p_Var4;
  _glist *x;
  _glist *x_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  t_pd f;
  char *pcVar6;
  t_float tVar7;
  t_float tVar8;
  undefined8 in_stack_fffffffffffff838;
  uint uVar11;
  t_word *ptVar9;
  undefined8 uVar10;
  undefined8 in_stack_fffffffffffff840;
  uint uVar14;
  char *pcVar13;
  int iVar15;
  float local_774;
  char *tags [3];
  char tag [80];
  char tag0 [80];
  t_word pix [200];
  undefined4 uVar12;
  
  uVar11 = *(uint *)&z[0xd].g_next;
  tags[0] = tag;
  tags[1] = tag0;
  tags[2] = "curve";
  if (vis == 0) {
    sprintf(tag0,"curve%lx",z);
    iVar3 = sprintf(tag,"curve%lx_data%lx",z,data);
    if (1 < (int)uVar11) {
      p_Var4 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar3));
      pdgui_vmess((char *)0x0,"crs",p_Var4,"delete",tag);
    }
  }
  else {
    tVar7 = fielddesc_getfloat((_fielddesc *)(z + 0xb),template,data,0);
    if ((tVar7 != 0.0) || (NAN(tVar7))) {
      sprintf(tag0,"curve%lx",z);
      sprintf(tag,"curve%lx_data%lx",z,data);
      if ((int)uVar11 < 2) {
        post("warning: drawing shapes need at least two points to be graphed");
      }
      else {
        uVar1 = *(uint *)&z[3].g_pd;
        tVar7 = fielddesc_getfloat((_fielddesc *)&z[8].g_next,template,data,1);
        uVar2 = 100;
        if (uVar11 < 100) {
          uVar2 = uVar11;
        }
        f = z[0xe].g_pd;
        for (uVar5 = 0; uVar11 = (uint)((ulong)in_stack_fffffffffffff838 >> 0x20),
            uVar14 = (uint)((ulong)in_stack_fffffffffffff840 >> 0x20), uVar2 << 4 != uVar5;
            uVar5 = uVar5 + 0x10) {
          tVar8 = fielddesc_getcoord((_fielddesc *)f,template,data,1);
          tVar8 = glist_xtopixels(glist,tVar8 + basex);
          *(t_float *)((long)pix + uVar5) = tVar8;
          tVar8 = fielddesc_getcoord((_fielddesc *)&f->c_nmethod,template,data,1);
          tVar8 = glist_ytopixels(glist,tVar8 + basey);
          *(t_float *)((long)pix + uVar5 + 8) = tVar8;
          f = (t_pd)&f->c_symbolmethod;
        }
        local_774 = 1.0;
        if (1.0 <= tVar7) {
          local_774 = tVar7;
        }
        if ((glist->field_0xe9 & 1) != 0) {
          iVar3 = glist_getzoom(glist);
          local_774 = local_774 * (float)iVar3;
        }
        tVar7 = fielddesc_getfloat((_fielddesc *)(z + 6),template,data,1);
        iVar3 = numbertocolor((int)tVar7);
        p_Var4 = glist_getcanvas((_glist *)CONCAT44(extraout_var_00,iVar3));
        pcVar6 = "polygon";
        if ((uVar1 & 1) == 0) {
          pcVar6 = "line";
        }
        iVar15 = 0;
        pcVar13 = (char *)((ulong)uVar14 << 0x20);
        pdgui_vmess((char *)0x0,"crr iiii rf ri rS",(double)local_774,p_Var4,"create",pcVar6,0,
                    (ulong)uVar11 << 0x20,pcVar13,0,"-width","-smooth",uVar1 >> 1 & 1,"-tags",3,tags
                   );
        p_Var4 = glist_getcanvas(x);
        ptVar9 = pix;
        pdgui_vmess((char *)0x0,"crs w",p_Var4,"coords",tag,(ulong)(uVar2 * 2),ptVar9);
        uVar12 = (undefined4)((ulong)ptVar9 >> 0x20);
        if ((uVar1 & 1) == 0) {
          p_Var4 = glist_getcanvas(x_00);
          uVar10 = CONCAT44(uVar12,iVar3);
          pcVar6 = "crs rk";
          iVar3 = iVar15;
        }
        else {
          tVar7 = fielddesc_getfloat((_fielddesc *)&z[3].g_next,template,data,1);
          iVar15 = numbertocolor((int)tVar7);
          p_Var4 = glist_getcanvas((_glist *)CONCAT44(extraout_var_01,iVar15));
          pcVar13 = "-outline";
          uVar10 = CONCAT44(uVar12,iVar15);
          pcVar6 = "crs rk rk";
        }
        pdgui_vmess((char *)0x0,pcVar6,p_Var4,"itemconfigure",tag,"-fill",uVar10,pcVar13,iVar3);
      }
    }
  }
  return;
}

Assistant:

static void curve_vis(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int vis)
{
    t_curve *x = (t_curve *)z;
    int i, n = x->x_npoints;
    t_fielddesc *f = x->x_vec;
    char tag0[80], tag[80];
    const char*tags[] = {tag, tag0, "curve"};
        /* see comment in plot_vis() */
    if (vis && !fielddesc_getfloat(&x->x_vis, template, data, 0))
        return;
    sprintf(tag0, "curve%lx", x);
    sprintf(tag , "curve%lx_data%lx", x, data);
    if (vis)
    {
        if (n > 1)
        {
            int flags = x->x_flags, closed = (flags & CLOSED);
            t_float width = fielddesc_getfloat(&x->x_width, template, data, 1);
            int outline;
            t_word pix[200];

            if (n > 100)
                n = 100;
                /* calculate the pixel values before we start printing
                out the TK message so that "error" printout won't be
                interspersed with it.  Only show up to 100 points so we don't
                have to allocate memory here. */
            for (i = 0, f = x->x_vec; i < n; i++, f += 2)
            {
                pix[2*i].w_float = glist_xtopixels(glist,
                    basex + fielddesc_getcoord(f, template, data, 1));
                pix[2*i+1].w_float = glist_ytopixels(glist,
                    basey + fielddesc_getcoord(f+1, template, data, 1));
            }
            if (width < 1) width = 1;
            if (glist->gl_isgraph)
                width *= glist_getzoom(glist);
            outline = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));

            pdgui_vmess(0, "crr iiii rf ri rS",
                glist_getcanvas(glist), "create",
                (flags & CLOSED)?"polygon":"line",
                0, 0, 0, 0,
                "-width", width,
                "-smooth", !!(flags & BEZ),
                "-tags", 3, tags);

            pdgui_vmess(0, "crs w",
                glist_getcanvas(glist), "coords", tag,
                2*n, pix);

            if (flags & CLOSED)
            {
                int fill = numbertocolor(
                    fielddesc_getfloat(&x->x_fillcolor, template, data, 1));
                pdgui_vmess(0, "crs rk rk",
                    glist_getcanvas(glist), "itemconfigure", tag,
                    "-fill", fill,
                    "-outline", outline);
            } else
                pdgui_vmess(0, "crs rk",
                    glist_getcanvas(glist), "itemconfigure", tag,
                    "-fill", outline);
        }
        else post("warning: drawing shapes need at least two points to be graphed");
    }
    else
    {
        if (n > 1)
            pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", tag);
    }
}